

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::CIBuildOnlyReporter::CIBuildOnlyReporter
          (CIBuildOnlyReporter *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__CIBuildOnlyReporter_001a1958;
  ::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_reporter).
              super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>,
             &reporter->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

CIBuildOnlyReporter::CIBuildOnlyReporter(std::shared_ptr<Reporter> reporter)
        : m_reporter(reporter)
    {
    }